

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RandomGen.cpp
# Opt level: O0

RandomGen * RandomGen::rndm(void)

{
  RandomGen *this;
  
  if (m_pInstance == (RandomGen *)0x0) {
    this = (RandomGen *)operator_new(0x18);
    RandomGen(this);
    m_pInstance = this;
  }
  return m_pInstance;
}

Assistant:

RandomGen* RandomGen::rndm() {
  if (!m_pInstance) m_pInstance = new RandomGen;
  return m_pInstance;
}